

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O3

AggregateFunction * __thiscall
duckdb::GetFirstFunction<true,false>
          (AggregateFunction *__return_storage_ptr__,duckdb *this,LogicalType *type)

{
  duckdb dVar1;
  reference pvVar2;
  AggregateFunction *pAVar3;
  AggregateFunction *extraout_RAX;
  LogicalType *in_RCX;
  LogicalType *type_00;
  LogicalType *pLVar4;
  FunctionNullHandling in_R8B;
  initializer_list<duckdb::LogicalType> __l;
  LogicalType local_1b8;
  allocator_type local_199;
  LogicalType local_198;
  LogicalType local_180;
  undefined1 local_168 [24];
  undefined1 local_150 [48];
  undefined1 local_120 [24];
  undefined1 local_108 [24];
  undefined1 local_f0 [24];
  undefined1 local_d8 [24];
  undefined1 local_c0 [24];
  undefined1 local_a8 [24];
  undefined1 local_90 [24];
  undefined1 local_78 [24];
  undefined1 local_60 [24];
  undefined1 local_48 [24];
  
  if (*this == (duckdb)0x15) {
    LogicalType::Verify((LogicalType *)this);
    GetDecimalFirstFunction<true,false>(__return_storage_ptr__,this,type_00);
    pvVar2 = vector<duckdb::LogicalType,_true>::operator[]
                       (&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                         arguments,0);
    if (pvVar2 != (reference)this) {
      pvVar2->id_ = (LogicalTypeId)*this;
      pvVar2->physical_type_ = (PhysicalType)this[1];
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&pvVar2->type_info_,(shared_ptr<duckdb::ExtraTypeInfo,_true> *)(this + 8));
    }
    pLVar4 = &(__return_storage_ptr__->super_BaseScalarFunction).return_type;
    if (pLVar4 == (LogicalType *)this) {
      return (AggregateFunction *)pLVar4;
    }
    (__return_storage_ptr__->super_BaseScalarFunction).return_type.id_ = (LogicalTypeId)*this;
    (__return_storage_ptr__->super_BaseScalarFunction).return_type.physical_type_ =
         (PhysicalType)this[1];
    pAVar3 = (AggregateFunction *)
             shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                       (&(__return_storage_ptr__->super_BaseScalarFunction).return_type.type_info_,
                        (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(this + 8));
    return pAVar3;
  }
  dVar1 = this[1];
  if ((byte)dVar1 < 200) {
    switch(dVar1) {
    case (duckdb)0x1:
    case (duckdb)0x3:
      LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffd0,(LogicalType *)this);
      LogicalType::LogicalType(&local_1b8,(LogicalType *)&stack0xffffffffffffffd0);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<signed_char>,signed_char,signed_char,duckdb::FirstFunction<true,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)&stack0xffffffffffffffd0,&local_1b8,
                 (LogicalType *)0x0,in_R8B);
      LogicalType::~LogicalType(&local_1b8);
      __return_storage_ptr__->simple_update = FirstFunctionSimpleUpdate<signed_char,true,false>;
      pLVar4 = (LogicalType *)&stack0xffffffffffffffd0;
      break;
    case (duckdb)0x2:
      LogicalType::LogicalType((LogicalType *)local_90,(LogicalType *)this);
      LogicalType::LogicalType(&local_1b8,(LogicalType *)local_90);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<unsigned_char>,unsigned_char,unsigned_char,duckdb::FirstFunction<true,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_90,&local_1b8,(LogicalType *)0x0,
                 in_R8B);
      LogicalType::~LogicalType(&local_1b8);
      __return_storage_ptr__->simple_update = FirstFunctionSimpleUpdate<unsigned_char,true,false>;
      pLVar4 = (LogicalType *)local_90;
      break;
    case (duckdb)0x4:
      LogicalType::LogicalType((LogicalType *)local_a8,(LogicalType *)this);
      LogicalType::LogicalType(&local_1b8,(LogicalType *)local_a8);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<unsigned_short>,unsigned_short,unsigned_short,duckdb::FirstFunction<true,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_a8,&local_1b8,(LogicalType *)0x0,
                 in_R8B);
      LogicalType::~LogicalType(&local_1b8);
      __return_storage_ptr__->simple_update = FirstFunctionSimpleUpdate<unsigned_short,true,false>;
      pLVar4 = (LogicalType *)local_a8;
      break;
    case (duckdb)0x5:
      LogicalType::LogicalType((LogicalType *)local_48,(LogicalType *)this);
      LogicalType::LogicalType(&local_1b8,(LogicalType *)local_48);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<short>,short,short,duckdb::FirstFunction<true,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_48,&local_1b8,(LogicalType *)0x0,
                 in_R8B);
      LogicalType::~LogicalType(&local_1b8);
      __return_storage_ptr__->simple_update = FirstFunctionSimpleUpdate<short,true,false>;
      pLVar4 = (LogicalType *)local_48;
      break;
    case (duckdb)0x6:
      LogicalType::LogicalType((LogicalType *)local_c0,(LogicalType *)this);
      LogicalType::LogicalType(&local_1b8,(LogicalType *)local_c0);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<unsigned_int>,unsigned_int,unsigned_int,duckdb::FirstFunction<true,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_c0,&local_1b8,(LogicalType *)0x0,
                 in_R8B);
      LogicalType::~LogicalType(&local_1b8);
      __return_storage_ptr__->simple_update = FirstFunctionSimpleUpdate<unsigned_int,true,false>;
      pLVar4 = (LogicalType *)local_c0;
      break;
    case (duckdb)0x7:
      LogicalType::LogicalType((LogicalType *)local_60,(LogicalType *)this);
      LogicalType::LogicalType(&local_1b8,(LogicalType *)local_60);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<int>,int,int,duckdb::FirstFunction<true,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_60,&local_1b8,(LogicalType *)0x0,
                 in_R8B);
      LogicalType::~LogicalType(&local_1b8);
      __return_storage_ptr__->simple_update = FirstFunctionSimpleUpdate<int,true,false>;
      pLVar4 = (LogicalType *)local_60;
      break;
    case (duckdb)0x8:
      LogicalType::LogicalType((LogicalType *)local_d8,(LogicalType *)this);
      LogicalType::LogicalType(&local_1b8,(LogicalType *)local_d8);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<unsigned_long>,unsigned_long,unsigned_long,duckdb::FirstFunction<true,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_d8,&local_1b8,(LogicalType *)0x0,
                 in_R8B);
      LogicalType::~LogicalType(&local_1b8);
      __return_storage_ptr__->simple_update = FirstFunctionSimpleUpdate<unsigned_long,true,false>;
      pLVar4 = (LogicalType *)local_d8;
      break;
    case (duckdb)0x9:
      LogicalType::LogicalType((LogicalType *)local_78,(LogicalType *)this);
      LogicalType::LogicalType(&local_1b8,(LogicalType *)local_78);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<long>,long,long,duckdb::FirstFunction<true,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_78,&local_1b8,(LogicalType *)0x0,
                 in_R8B);
      LogicalType::~LogicalType(&local_1b8);
      __return_storage_ptr__->simple_update = FirstFunctionSimpleUpdate<long,true,false>;
      pLVar4 = (LogicalType *)local_78;
      break;
    default:
      goto switchD_007a8072_caseD_a;
    case (duckdb)0xb:
      LogicalType::LogicalType((LogicalType *)local_120,(LogicalType *)this);
      LogicalType::LogicalType(&local_1b8,(LogicalType *)local_120);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<float>,float,float,duckdb::FirstFunction<true,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_120,&local_1b8,(LogicalType *)0x0
                 ,in_R8B);
      LogicalType::~LogicalType(&local_1b8);
      __return_storage_ptr__->simple_update = FirstFunctionSimpleUpdate<float,true,false>;
      pLVar4 = (LogicalType *)local_120;
      break;
    case (duckdb)0xc:
      LogicalType::LogicalType((LogicalType *)(local_150 + 0x18),(LogicalType *)this);
      LogicalType::LogicalType(&local_1b8,(LogicalType *)(local_150 + 0x18));
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<double>,double,double,duckdb::FirstFunction<true,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)(local_150 + 0x18),&local_1b8,
                 (LogicalType *)0x0,in_R8B);
      LogicalType::~LogicalType(&local_1b8);
      __return_storage_ptr__->simple_update = FirstFunctionSimpleUpdate<double,true,false>;
      pLVar4 = (LogicalType *)(local_150 + 0x18);
      break;
    case (duckdb)0x15:
      LogicalType::LogicalType((LogicalType *)local_150,(LogicalType *)this);
      LogicalType::LogicalType(&local_1b8,(LogicalType *)local_150);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<duckdb::interval_t>,duckdb::interval_t,duckdb::interval_t,duckdb::FirstFunction<true,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_150,&local_1b8,(LogicalType *)0x0
                 ,in_R8B);
      LogicalType::~LogicalType(&local_1b8);
      __return_storage_ptr__->simple_update =
           FirstFunctionSimpleUpdate<duckdb::interval_t,true,false>;
      pLVar4 = (LogicalType *)local_150;
    }
  }
  else {
    if (dVar1 == (duckdb)0xc8) {
      LogicalType::LogicalType((LogicalType *)local_168,(LogicalType *)this);
      LogicalType::LogicalType(&local_180,(LogicalType *)this);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::FirstState<duckdb::string_t>,duckdb::string_t,duckdb::string_t,duckdb::FirstFunctionString<true,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_168,&local_180,in_RCX);
      LogicalType::~LogicalType(&local_180);
      pLVar4 = (LogicalType *)local_168;
      goto LAB_007a8632;
    }
    if (dVar1 == (duckdb)0xcb) {
      LogicalType::LogicalType((LogicalType *)local_108,(LogicalType *)this);
      LogicalType::LogicalType(&local_1b8,(LogicalType *)local_108);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::FirstFunction<true,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_108,&local_1b8,(LogicalType *)0x0
                 ,in_R8B);
      LogicalType::~LogicalType(&local_1b8);
      __return_storage_ptr__->simple_update =
           FirstFunctionSimpleUpdate<duckdb::uhugeint_t,true,false>;
      pLVar4 = (LogicalType *)local_108;
      goto LAB_007a8632;
    }
    if (dVar1 == (duckdb)0xcc) {
      LogicalType::LogicalType((LogicalType *)local_f0,(LogicalType *)this);
      LogicalType::LogicalType(&local_1b8,(LogicalType *)local_f0);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::FirstFunction<true,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_f0,&local_1b8,(LogicalType *)0x0,
                 in_R8B);
      LogicalType::~LogicalType(&local_1b8);
      __return_storage_ptr__->simple_update =
           FirstFunctionSimpleUpdate<duckdb::hugeint_t,true,false>;
      pLVar4 = (LogicalType *)local_f0;
      goto LAB_007a8632;
    }
switchD_007a8072_caseD_a:
    LogicalType::LogicalType(&local_198,(LogicalType *)this);
    __l._M_len = 1;
    __l._M_array = &local_198;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1b8,__l,
               &local_199);
    AggregateFunction::AggregateFunction
              (__return_storage_ptr__,(vector<duckdb::LogicalType,_true> *)&local_1b8,
               (LogicalType *)this,
               AggregateFunction::StateSize<duckdb::FirstState<duckdb::string_t>>,
               AggregateFunction::
               StateInitialize<duckdb::FirstState<duckdb::string_t>,duckdb::FirstVectorFunction<true,false>,(duckdb::AggregateDestructorType)0>
               ,FirstVectorFunction<true,_false>::Update,
               AggregateFunction::
               StateCombine<duckdb::FirstState<duckdb::string_t>,duckdb::FirstVectorFunction<true,false>>
               ,AggregateFunction::
                StateVoidFinalize<duckdb::FirstState<duckdb::string_t>,duckdb::FirstVectorFunction<true,false>>
               ,(aggregate_simple_update_t)0x0,FirstVectorFunction<true,_false>::Bind,
               AggregateFunction::
               StateDestroy<duckdb::FirstState<duckdb::string_t>,duckdb::FirstVectorFunction<true,false>>
               ,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
               (aggregate_deserialize_t)0x0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1b8);
    pLVar4 = &local_198;
  }
LAB_007a8632:
  LogicalType::~LogicalType(pLVar4);
  return extraout_RAX;
}

Assistant:

static AggregateFunction GetFirstFunction(const LogicalType &type) {
	if (type.id() == LogicalTypeId::DECIMAL) {
		type.Verify();
		AggregateFunction function = GetDecimalFirstFunction<LAST, SKIP_NULLS>(type);
		function.arguments[0] = type;
		function.return_type = type;
		return function;
	}
	switch (type.InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return GetFirstAggregateTemplated<int8_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::INT16:
		return GetFirstAggregateTemplated<int16_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::INT32:
		return GetFirstAggregateTemplated<int32_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::INT64:
		return GetFirstAggregateTemplated<int64_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::UINT8:
		return GetFirstAggregateTemplated<uint8_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::UINT16:
		return GetFirstAggregateTemplated<uint16_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::UINT32:
		return GetFirstAggregateTemplated<uint32_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::UINT64:
		return GetFirstAggregateTemplated<uint64_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::INT128:
		return GetFirstAggregateTemplated<hugeint_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::UINT128:
		return GetFirstAggregateTemplated<uhugeint_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::FLOAT:
		return GetFirstAggregateTemplated<float, LAST, SKIP_NULLS>(type);
	case PhysicalType::DOUBLE:
		return GetFirstAggregateTemplated<double, LAST, SKIP_NULLS>(type);
	case PhysicalType::INTERVAL:
		return GetFirstAggregateTemplated<interval_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::VARCHAR:
		if (LAST) {
			return AggregateFunction::UnaryAggregateDestructor<FirstState<string_t>, string_t, string_t,
			                                                   FirstFunctionString<LAST, SKIP_NULLS>>(type, type);
		} else {
			return AggregateFunction::UnaryAggregate<FirstState<string_t>, string_t, string_t,
			                                         FirstFunctionString<LAST, SKIP_NULLS>>(type, type);
		}
	default: {
		using OP = FirstVectorFunction<LAST, SKIP_NULLS>;
		using STATE = FirstState<string_t>;
		return AggregateFunction(
		    {type}, type, AggregateFunction::StateSize<STATE>, AggregateFunction::StateInitialize<STATE, OP>,
		    OP::Update, AggregateFunction::StateCombine<STATE, OP>, AggregateFunction::StateVoidFinalize<STATE, OP>,
		    nullptr, OP::Bind, LAST ? AggregateFunction::StateDestroy<STATE, OP> : nullptr, nullptr, nullptr);
	}
	}
}